

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.h
# Opt level: O3

void __thiscall
chatra::AsyncOperatorTable::add
          (AsyncOperatorTable *this,Package *package,Node *node,Operator op,
          vector<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_> *args)

{
  undefined1 *puVar1;
  char cVar2;
  pointer pAVar3;
  pointer pAVar4;
  pointer pAVar5;
  _Fwd_list_node_base *p_Var6;
  _Fwd_list_node_base *local_38;
  value_type *method;
  
  p_Var6 = (_Fwd_list_node_base *)operator_new(0x38);
  local_38 = p_Var6 + 1;
  pAVar4 = (args->super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pAVar5 = (args->super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pAVar3 = (args->super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>).
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (args->super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args->super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (args->super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var6[1]._M_next = (_Fwd_list_node_base *)node;
  p_Var6[2]._M_next = (_Fwd_list_node_base *)package;
  *(Operator *)&p_Var6[3]._M_next = op;
  p_Var6[4]._M_next = (_Fwd_list_node_base *)pAVar4;
  p_Var6[5]._M_next = (_Fwd_list_node_base *)pAVar5;
  p_Var6[6]._M_next = (_Fwd_list_node_base *)pAVar3;
  p_Var6->_M_next =
       (this->methods).
       super__Fwd_list_base<chatra::OperatorMethod,_std::allocator<chatra::OperatorMethod>_>._M_impl
       ._M_head._M_next;
  (this->methods).
  super__Fwd_list_base<chatra::OperatorMethod,_std::allocator<chatra::OperatorMethod>_>._M_impl.
  _M_head._M_next = p_Var6;
  do {
    LOCK();
    puVar1 = &(this->super_AsyncReadWrite<chatra::OperatorTable>).
              super_AsyncRead<chatra::OperatorTable>.field_0x41c4;
    cVar2 = *puVar1;
    *puVar1 = 1;
    UNLOCK();
  } while (cVar2 != '\0');
  AsyncRead<chatra::OperatorTable>::
  write<chatra::AsyncOperatorTable::add(chatra::Package*,chatra::Node*,chatra::Operator,std::vector<chatra::ArgumentDef,std::allocator<chatra::ArgumentDef>>)::_lambda(chatra::OperatorTable&)_1_>
            ((AsyncRead<chatra::OperatorTable> *)this,(anon_class_8_1_60e9c21f)&local_38);
  (this->super_AsyncReadWrite<chatra::OperatorTable>).super_AsyncRead<chatra::OperatorTable>.
  field_0x41c4 = 0;
  return;
}

Assistant:

void add(Package* package, Node* node, Operator op, std::vector<ArgumentDef> args) {
		methods.emplace_front(package, node, op, std::move(args));
		auto method = &methods.front();
		writeAsync([&](OperatorTable& table) {
			if (method->args.size() == 1)
				table.addOp1(method);
			else
				table.addOp2(method);
		});
	}